

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

bool __thiscall soinn::ESOINN::needAddEdge(ESOINN *this,Vertex *firstWinner,Vertex *secondWinner)

{
  double dVar1;
  int iVar2;
  Vertex pvVar3;
  Vertex pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  double dVar9;
  
  if ((*(int *)((long)*firstWinner + 0x38) != -1) &&
     (*(int *)((long)*firstWinner + 0x38) != *(int *)((long)*secondWinner + 0x38) &&
      *(int *)((long)*secondWinner + 0x38) != -1)) {
    pvVar3 = *firstWinner;
    iVar2 = *(int *)((long)pvVar3 + 0x38);
    dVar5 = meanDensity(this,iVar2);
    dVar6 = maxDensity(this,iVar2);
    uVar8 = 0;
    if (dVar5 + dVar5 < dVar6) {
      if ((dVar5 * 3.0 < dVar6) || (dVar6 <= dVar5 + dVar5)) {
        uVar8 = 0x3ff00000;
      }
      else {
        uVar8 = 0x3fe00000;
      }
    }
    pvVar4 = *secondWinner;
    iVar2 = *(int *)((long)pvVar4 + 0x38);
    dVar5 = meanDensity(this,iVar2);
    dVar7 = maxDensity(this,iVar2);
    dVar9 = 0.0;
    if (dVar5 + dVar5 < dVar7) {
      if ((dVar5 * 3.0 < dVar7) || (dVar7 <= dVar5 + dVar5)) {
        dVar9 = 1.0;
      }
      else {
        dVar9 = 0.5;
      }
    }
    dVar5 = *(double *)((long)pvVar4 + 0x40);
    dVar1 = *(double *)((long)pvVar3 + 0x40);
    if (dVar1 <= dVar5) {
      dVar5 = dVar1;
    }
    return (bool)(-(dVar6 * (double)((ulong)uVar8 << 0x20) < dVar5) & -(dVar7 * dVar9 < dVar5) & 1);
  }
  return true;
}

Assistant:

bool ESOINN::needAddEdge(Vertex& firstWinner, Vertex &secondWinner)
{
    if(graph[firstWinner].classId == -1 || graph[secondWinner].classId == -1)
    {
        return true;
    }
    else if(graph[firstWinner].classId == graph[secondWinner].classId)
    {
        return true;
    }
    else if(graph[firstWinner].classId != graph[secondWinner].classId && needMergeClasses(firstWinner, secondWinner))
    {
        return true;
    }
    return false;
}